

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall node::runPrepare(node *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar1;
  char *pcVar2;
  char cVar3;
  pointer pbVar4;
  __type _Var5;
  uchar uVar6;
  int j;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  _List_node_base *p_Var10;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *this_01;
  ulong uVar11;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  p;
  vector<int,_std::allocator<int>_> labelLines;
  string tmp;
  string line;
  string local_50 [32];
  
  labelLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  labelLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  labelLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_01 = &this->labels;
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::clear(this_01);
  this_00 = &this->code;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(this_00,(long)(this->inputCode).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->inputCode).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
  uVar6 = '\0';
  do {
    uVar11 = (ulong)(char)uVar6;
    if ((ulong)((long)(this->inputCode).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->inputCode).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar11) {
      uVar11 = 0;
      do {
        if ((ulong)((long)labelLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)labelLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar11) {
          uVar9 = 0;
          while( true ) {
            uVar11 = (ulong)uVar9;
            pbVar4 = (this->code).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->code).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <=
                uVar11) break;
            uVar7 = 0;
            while (pbVar4[uVar11]._M_string_length != uVar7) {
              pcVar2 = pbVar4[uVar11]._M_dataplus._M_p + uVar7;
              uVar7 = uVar7 + 1;
              if (*pcVar2 == ':') goto LAB_0010b3dc;
            }
            uVar7 = pbVar4[uVar11]._M_string_length & 0xffffffff;
            do {
              uVar1 = uVar7 - 1;
              if ((int)(uint)uVar1 < 0) break;
              pbVar4 = (this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              cVar3 = pbVar4[uVar11]._M_dataplus._M_p[(uint)uVar1 & 0x7fffffff];
              if ((cVar3 != ',') && (cVar3 != ' ')) {
                std::__cxx11::string::erase((ulong)(pbVar4 + uVar11),uVar7);
              }
              uVar7 = uVar1;
            } while ((cVar3 == ',') || (cVar3 == ' '));
            uVar9 = uVar9 + 1;
          }
          bVar8 = true;
LAB_0010b3de:
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&labelLines.super__Vector_base<int,_std::allocator<int>_>);
          return bVar8;
        }
        p.first._M_dataplus._M_p = (pointer)&p.first.field_2;
        p.first._M_string_length = 0;
        p.first.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::substr
                  ((ulong)&line,
                   (ulong)((this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start +
                          labelLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11]));
        std::__cxx11::string::operator=((string *)&p,(string *)&line);
        std::__cxx11::string::~string((string *)&line);
        p_Var10 = (_List_node_base *)this_01;
        do {
          p_Var10 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                       *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var10 == (_List_node_base *)this_01) {
            std::__cxx11::string::~string((string *)&p);
LAB_0010b3dc:
            bVar8 = false;
            goto LAB_0010b3de;
          }
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var10 + 1),&p.first);
        } while (!_Var5);
        std::__cxx11::string::~string((string *)&p);
        uVar11 = uVar11 + 1;
      } while( true );
    }
    bVar8 = false;
    uVar7 = 0;
    do {
      pbVar4 = (this->inputCode).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->inputCode).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <= uVar7)
      break;
      std::__cxx11::string::string((string *)&line,(string *)(pbVar4 + uVar11));
      cVar3 = line._M_dataplus._M_p[uVar7];
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      tmp._M_string_length = 0;
      tmp.field_2._M_local_buf[0] = '\0';
      if (cVar3 == ':') {
        p.first._M_dataplus._M_p = (pointer)&p.first.field_2;
        p.first._M_string_length = 0;
        p.first.field_2._M_local_buf[0] = '\0';
        p.second = '\0';
        std::__cxx11::string::substr((ulong)local_50,(ulong)&line);
        std::__cxx11::string::operator=((string *)&p,local_50);
        std::__cxx11::string::~string(local_50);
        p.second = uVar6;
        std::__cxx11::
        list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
        ::push_back(this_01,&p);
        std::__cxx11::string::substr((ulong)local_50,(ulong)&line);
        std::__cxx11::string::find_first_not_of((char *)local_50,0x10e0c4);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::substr((ulong)local_50,(ulong)&line);
        std::__cxx11::string::operator=
                  ((string *)
                   ((this_00->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar11),local_50);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::~string((string *)&p);
        bVar8 = true;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      std::__cxx11::string::~string((string *)&tmp);
      std::__cxx11::string::~string((string *)&line);
    } while (cVar3 != ':');
    if (!bVar8) {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((this->code).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar11));
    }
    uVar6 = uVar6 + '\x01';
  } while( true );
}

Assistant:

bool node::runPrepare(){
  std::vector<int> labelLines;
  labels.clear();
  code.resize(inputCode.size());
  for (int8_t i = 0; i < inputCode.size(); i++){
    bool label=false;
    for(unsigned int j=0;j<inputCode.size();j++){
      string line=inputCode[i];
      char ch=line[j];
      string tmp;      
      if(ch==':'){
	std::pair<std::string, uint8_t> p;
	int c;
	p.first=line.substr(0,j);
	p.second=i;
	labels.push_back(p);
	label=true;
	c=line.substr(j+1).find_first_not_of(" ");
	code[i]=line.substr(c+j+1);
	break;
      }
    }
    if(label==false){
      code[i]=inputCode[i];
    }
  }
  for(int i=0; i<labelLines.size();i++){
    string operand;
    bool label_exists=false;
    operand=code[labelLines[i]].substr(4);
    for(list<pair<string, uint8_t> >::iterator j=labels.begin();j!=labels.end();j++){
      if(j->first==operand){
	label_exists=true;
	break;
      }
    }
    if(label_exists==false)
      return false;
  }
  for(unsigned int i=0;i<code.size();i++){
    bool space=false;
    int  remove_count=0;
    for(int j=0; j<code[i].length();j++){
      char ch=code[i].c_str()[j];
      if(ch == ' '||ch==','){
	if(space){
	  code[i].erase(j, 1);              //get rid of whitespace
	  j--;
	}
	space=true;
      }
      if(ch==':')
	return false;
      else
	space=false;
    }
    for(int j=code[i].length()-1;j>=0;j--){
      char ch=code[i].c_str()[j];
      if(ch==' '||ch==',')
	remove_count++;
      else{
	code[i].erase(j+1, remove_count);
	break;
      }
    }
  }
  return true;
}